

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead128a.c
# Opt level: O2

size_t ascon_aead128a_decrypt_final
                 (ascon_aead_ctx_t *ctx,uint8_t *plaintext,_Bool *is_tag_valid,uint8_t *expected_tag
                 ,size_t expected_tag_len)

{
  uint8_t *bytes;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint_fast8_t n;
  _Bool _Var6;
  uint64_t uVar7;
  uint64_t uVar8;
  
  if ((ctx->bufstate).flow_state != '\n') {
    ascon_128a_finalise_assoc_data(ctx);
  }
  bVar1 = (ctx->bufstate).buffer_len;
  bytes = (ctx->bufstate).buffer;
  if (bVar1 < 8) {
    uVar7 = bigendian_decode_varlen(bytes,bVar1);
    bigendian_encode_varlen(plaintext,(ctx->bufstate).sponge.x0 ^ uVar7,(ctx->bufstate).buffer_len);
    uVar8 = mask_most_signif_bytes((ctx->bufstate).buffer_len);
    bVar1 = (ctx->bufstate).buffer_len;
    (ctx->bufstate).sponge.x0 =
         0x80L << ((ulong)(byte)(bVar1 * -8 + 0x38) & 0x3f) ^
         (~uVar8 & (ctx->bufstate).sponge.x0 | uVar7);
  }
  else {
    uVar7 = bigendian_decode_u64(bytes);
    n = (ctx->bufstate).buffer_len + 0xf8;
    uVar8 = bigendian_decode_varlen((ctx->bufstate).buffer + 8,n);
    bigendian_encode_u64(plaintext,(ctx->bufstate).sponge.x0 ^ uVar7);
    bigendian_encode_varlen(plaintext + 8,(ctx->bufstate).sponge.x1 ^ uVar8,n);
    (ctx->bufstate).sponge.x0 = uVar7;
    uVar7 = mask_most_signif_bytes(n);
    (ctx->bufstate).sponge.x1 =
         0x80L << ((ulong)(byte)(n * -8 + 0x38) & 0x3f) ^
         (~uVar7 & (ctx->bufstate).sponge.x1 | uVar8);
    bVar1 = (ctx->bufstate).buffer_len;
  }
  uVar2 = *(uint *)((long)&(ctx->bufstate).sponge.x2 + 4);
  uVar7 = (ctx->bufstate).sponge.x3;
  uVar3 = *(uint *)((long)&(ctx->bufstate).sponge.x3 + 4);
  uVar4 = *(uint *)((long)&ctx->k0 + 4);
  uVar8 = ctx->k1;
  uVar5 = *(uint *)((long)&ctx->k1 + 4);
  *(uint *)&(ctx->bufstate).sponge.x2 = (uint)(ctx->bufstate).sponge.x2 ^ (uint)ctx->k0;
  *(uint *)((long)&(ctx->bufstate).sponge.x2 + 4) = uVar2 ^ uVar4;
  *(uint *)&(ctx->bufstate).sponge.x3 = (uint)uVar7 ^ (uint)uVar8;
  *(uint *)((long)&(ctx->bufstate).sponge.x3 + 4) = uVar3 ^ uVar5;
  ascon_permutation_12((ascon_sponge_t *)ctx);
  uVar2 = *(uint *)((long)&(ctx->bufstate).sponge.x3 + 4);
  uVar7 = (ctx->bufstate).sponge.x4;
  uVar3 = *(uint *)((long)&(ctx->bufstate).sponge.x4 + 4);
  uVar4 = *(uint *)((long)&ctx->k0 + 4);
  uVar8 = ctx->k1;
  uVar5 = *(uint *)((long)&ctx->k1 + 4);
  *(uint *)&(ctx->bufstate).sponge.x3 = (uint)(ctx->bufstate).sponge.x3 ^ (uint)ctx->k0;
  *(uint *)((long)&(ctx->bufstate).sponge.x3 + 4) = uVar2 ^ uVar4;
  *(uint *)&(ctx->bufstate).sponge.x4 = (uint)uVar7 ^ (uint)uVar8;
  *(uint *)((long)&(ctx->bufstate).sponge.x4 + 4) = uVar3 ^ uVar5;
  _Var6 = ascon_aead_is_tag_valid(ctx,expected_tag,expected_tag_len);
  *is_tag_valid = _Var6;
  ascon_aead_cleanup(ctx);
  return (ulong)bVar1;
}

Assistant:

ASCON_API size_t
ascon_aead128a_decrypt_final(ascon_aead_ctx_t* const ctx,
                             uint8_t* plaintext,
                             bool* const is_tag_valid,
                             const uint8_t* const expected_tag,
                             const size_t expected_tag_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(plaintext != NULL);
    ASCON_ASSERT(expected_tag_len == 0 || expected_tag != NULL);
    ASCON_ASSERT(is_tag_valid != NULL);
    ASCON_ASSERT(ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_INITIALISED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_ASSOC_DATA_UPDATED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_DECRYPT_UPDATED);
    if (ctx->bufstate.flow_state != ASCON_FLOW_AEAD128a_DECRYPT_UPDATED)
    {
        // Finalise the associated data if not already done sos.
        ascon_128a_finalise_assoc_data(ctx);
    }
    size_t freshly_generated_plaintext_len = 0;
    // If there is any remaining less-than-a-block ciphertext to be absorbed
    // cached in the buffer, pad it and absorb it.
    if (ctx->bufstate.buffer_len >= ASCON_RATE)
    {
        // Absorb ciphertext in buffer
        const uint64_t c_0 = bigendian_decode_u64(ctx->bufstate.buffer);
        const uint_fast8_t second_half =
                (uint_fast8_t) (ctx->bufstate.buffer_len - ASCON_RATE);
        const uint64_t c_1 = bigendian_decode_varlen(
                ctx->bufstate.buffer + ASCON_RATE, second_half);
        // Squeeze out last plaintext bytes
        bigendian_encode_u64(plaintext, ctx->bufstate.sponge.x0 ^ c_0);
        bigendian_encode_varlen(plaintext + ASCON_RATE,
                                ctx->bufstate.sponge.x1 ^ c_1,
                                second_half);
        // Final state changes at decryption's end
        ctx->bufstate.sponge.x0 = c_0;
        ctx->bufstate.sponge.x1 &= ~mask_most_signif_bytes(second_half);
        ctx->bufstate.sponge.x1 |= c_1;
        ctx->bufstate.sponge.x1 ^= PADDING(second_half);
    }
    else
    {
        // Absorb ciphertext in buffer
        const uint64_t c_0 = bigendian_decode_varlen(ctx->bufstate.buffer,
                                                     ctx->bufstate.buffer_len);
        // Squeeze out last plaintext bytes
        bigendian_encode_varlen(plaintext, ctx->bufstate.sponge.x0 ^ c_0,
                                ctx->bufstate.buffer_len);
        // Final state changes at decryption's end
        ctx->bufstate.sponge.x0 &= ~mask_most_signif_bytes(ctx->bufstate.buffer_len);
        ctx->bufstate.sponge.x0 |= c_0;
        ctx->bufstate.sponge.x0 ^= PADDING(ctx->bufstate.buffer_len);
    }
    freshly_generated_plaintext_len += ctx->bufstate.buffer_len;
    // End of decryption, start of tag validation.
    // Apply key twice more with a permutation to set the state for the tag.
    ctx->bufstate.sponge.x2 ^= ctx->k0;
    ctx->bufstate.sponge.x3 ^= ctx->k1;
    ascon_permutation_12(&ctx->bufstate.sponge);
    ctx->bufstate.sponge.x3 ^= ctx->k0;
    ctx->bufstate.sponge.x4 ^= ctx->k1;
    // Validate tag with variable len
    *is_tag_valid = ascon_aead_is_tag_valid(ctx, expected_tag, expected_tag_len);
    // Final security cleanup of the internal state and key.
    ascon_aead_cleanup(ctx);
    return freshly_generated_plaintext_len;
}